

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *pcVar1;
  
  do {
    pcVar1 = this;
    this = pcVar1->Parent;
  } while (this != (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pcVar1->Target);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionDAGChecker::TopTarget() const
{
  const cmGeneratorExpressionDAGChecker *top = this;
  const cmGeneratorExpressionDAGChecker *parent = this->Parent;
  while (parent)
    {
    top = parent;
    parent = parent->Parent;
    }
  return top->Target;
}